

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O1

longlong __thiscall
manager::Manager<uttt::IBoard>::AddBot(Manager<uttt::IBoard> *this,IBot<uttt::IBoard> *bot)

{
  double dVar1;
  long lVar2;
  int iVar3;
  mapped_type pBVar4;
  undefined4 extraout_var;
  mapped_type *ppBVar5;
  longlong id;
  long local_28;
  
  lVar2 = g_bot_ids;
  local_28 = g_bot_ids;
  g_bot_ids = g_bot_ids + 1;
  pBVar4 = (mapped_type)operator_new(0x18);
  dVar1 = g_default_rating;
  pBVar4->id = lVar2;
  iVar3 = (*bot->_vptr_IBot[2])(bot);
  pBVar4->bot = (IBot<uttt::IBoard> *)CONCAT44(extraout_var,iVar3);
  pBVar4->rating = dVar1;
  ppBVar5 = std::__detail::
            _Map_base<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->bots,&local_28);
  *ppBVar5 = pBVar4;
  return local_28;
}

Assistant:

long long
Manager<IGame>::AddBot(const game::IBot<IGame> *bot)
{
    long long id = g_bot_ids;
    ++g_bot_ids;

    auto m_bot = new Bot<IGame>(id, bot, g_default_rating);
    bots[id] = m_bot;
    return id;
}